

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

Name getMemoryName(BinaryenModuleRef module,char *memoryName)

{
  pointer puVar1;
  IString *this;
  undefined1 in_CL;
  long lVar2;
  string_view sVar3;
  
  if (memoryName == (char *)0x0) {
    puVar1 = (module->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(module->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar2 == 8) {
      return (Name)*(string_view *)
                    (puVar1->_M_t).
                    super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    }
    this = (IString *)strlen((char *)0x0);
    in_CL = (undefined1)lVar2;
    memoryName = (char *)0x0;
  }
  else {
    this = (IString *)strlen(memoryName);
  }
  sVar3._M_str = (char *)0x0;
  sVar3._M_len = (size_t)memoryName;
  sVar3 = wasm::IString::interned(this,sVar3,(bool)in_CL);
  return (IString)(IString)sVar3;
}

Assistant:

static Name getMemoryName(BinaryenModuleRef module, const char* memoryName) {
  if (memoryName == nullptr && module->memories.size() == 1) {
    return module->memories[0]->name;
  }

  return memoryName;
}